

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O2

void chacha(chacha_key *key,chacha_iv *iv,uint8_t *in,uint8_t *out,size_t inlen,size_t rounds)

{
  chacha_state_internal *state;
  chacha_state S;
  chacha_state_internal local_88;
  
  state = &local_88;
  local_88.s._0_8_ = *(undefined8 *)key->b;
  local_88.s._8_8_ = *(undefined8 *)(key->b + 8);
  local_88.s._16_8_ = *(undefined8 *)(key->b + 0x10);
  local_88.s._24_8_ = *(undefined8 *)(key->b + 0x18);
  local_88.s[0x20] = '\0';
  local_88.s[0x21] = '\0';
  local_88.s[0x22] = '\0';
  local_88.s[0x23] = '\0';
  local_88.s[0x24] = '\0';
  local_88.s[0x25] = '\0';
  local_88.s[0x26] = '\0';
  local_88.s[0x27] = '\0';
  local_88.s._40_8_ = *(undefined8 *)iv->b;
  local_88.leftover = 0;
  local_88.rounds = rounds;
  chacha_consume(state,in,out,inlen);
  return;
}

Assistant:

void
chacha(const chacha_key *key, const chacha_iv *iv, const uint8_t *in, uint8_t *out, size_t inlen, size_t rounds) {
    chacha_state S;
    chacha_init(&S, key, iv, rounds);
    chacha_consume((chacha_state_internal *)&S, in, out, inlen);
}